

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void output_module_primary_report
               (string *module,output_format out_fmt,bool track_sources,bool track_tests)

{
  module_primary_actions local_68;
  module_primary_txt_actions actions_2;
  undefined1 local_50 [8];
  module_primary_csv_actions actions_1;
  module_primary_html_actions actions;
  bool track_tests_local;
  bool track_sources_local;
  output_format out_fmt_local;
  string *module_local;
  
  if (out_fmt == output_format_html) {
    module_primary_html_actions::module_primary_html_actions
              ((module_primary_html_actions *)((long)&actions_1.module_.field_2 + 8));
    output_module_primary_report
              (module,(module_primary_actions *)((long)&actions_1.module_.field_2 + 8),track_sources
               ,track_tests);
  }
  else if (out_fmt == output_format_csv) {
    module_primary_csv_actions::module_primary_csv_actions((module_primary_csv_actions *)local_50);
    output_module_primary_report
              (module,(module_primary_actions *)local_50,track_sources,track_tests);
    module_primary_csv_actions::~module_primary_csv_actions((module_primary_csv_actions *)local_50);
  }
  else {
    module_primary_txt_actions::module_primary_txt_actions((module_primary_txt_actions *)&local_68);
    output_module_primary_report(module,&local_68,track_sources,track_tests);
  }
  return;
}

Assistant:

static void output_module_primary_report( std::string const & module, output_format out_fmt, bool track_sources, bool track_tests )
{
    if( out_fmt == output_format_html )
    {
        module_primary_html_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else if( out_fmt == output_format_csv )
    {
        module_primary_csv_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else
    {
        module_primary_txt_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
}